

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::PropagateIntRangeBinary
          (GlobOpt *this,Instr *instr,int32 min1,int32 max1,int32 min2,int32 max2,int32 *pNewMin,
          int32 *pNewMax)

{
  code *pcVar1;
  int32 iVar2;
  bool bVar3;
  uint32 uVar4;
  int *piVar5;
  uint *puVar6;
  undefined4 *puVar7;
  byte bVar8;
  uint local_9c;
  uint32 temp;
  uint32 umax1;
  uint32 umin1;
  IntConstantBounds local_8c;
  IntConstantBounds src2NewBounds;
  int local_7c;
  int local_78;
  uint local_74 [3];
  int local_68;
  int local_64;
  int local_60;
  int32 nrTopBits;
  int32 max1FreeTopBitCount;
  int32 min1FreeTopBitCount;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  int32 tmp2;
  int32 tmp;
  int32 max;
  int32 min;
  int32 max2_local;
  int32 min2_local;
  int32 max1_local;
  int32 min1_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  tmp = -0x80000000;
  tmp2 = 0x7fffffff;
  max = max2;
  min = min2;
  max2_local = max1;
  min2_local = min1;
  _max1_local = instr;
  instr_local = (Instr *)this;
  switch(*(int *)&instr->m_opcode - 0x35U & 0xffff) {
  case 0:
    if ((min1 != -0x80000000) || (min2 != -0x80000000)) {
      local_50 = max1;
      local_4c = min1;
      puVar6 = max<unsigned_int>(&local_4c,&local_50);
      local_34 = *puVar6;
      min1FreeTopBitCount = min;
      max1FreeTopBitCount = max;
      puVar6 = max<unsigned_int>((uint *)&min1FreeTopBitCount,(uint *)&max1FreeTopBitCount);
      if (local_34 < *puVar6) {
        tmp = min2_local;
        tmp2 = max2_local;
      }
      else {
        tmp = min;
        tmp2 = max;
      }
      if ((uint)tmp2 < (uint)tmp) {
        tmp2 = tmp;
      }
      if (tmp2 < 0) {
        tmp2 = 0x7fffffff;
      }
      if (tmp < 0) {
        tmp = -0x80000000;
      }
      else {
        tmp = 0;
      }
    }
    break;
  case 1:
  case 2:
    local_40 = max1;
    local_3c = min1;
    puVar6 = max<unsigned_int>(&local_3c,&local_40);
    local_34 = *puVar6;
    local_44 = min;
    local_48 = max;
    puVar6 = max<unsigned_int>(&local_44,&local_48);
    local_38 = *puVar6;
    tmp2 = local_38;
    if (local_38 < local_34) {
      tmp2 = local_34;
    }
    if (tmp2 < 0) {
      tmp = -0x80000000;
      tmp2 = 0x7fffffff;
    }
    else {
      uVar4 = Math::Log2(tmp2);
      tmp2 = (1 << ((byte)uVar4 & 0x1f)) * 2 + -1;
      tmp = 0;
    }
    break;
  case 3:
    if ((min2 == max2) || (((uint)min2 < 0x20 && ((uint)max2 < 0x20)))) {
      min = min2 & 0x1f;
      max = max2 & 0x1f;
    }
    else {
      min = 0;
      max = 0x1f;
    }
    if (min1 == 0) {
      nrTopBits = 0x20;
    }
    else {
      uVar4 = Math::Log2(min1);
      nrTopBits = 0x20 - (uVar4 + 1);
    }
    if (max2_local == 0) {
      local_60 = 0x20;
    }
    else {
      uVar4 = Math::Log2(max2_local);
      local_60 = 0x20 - (uVar4 + 1);
    }
    if ((max < nrTopBits) && (max < local_60)) {
      if (min2_local != 0) {
        uVar4 = Math::Log2(min2_local);
        min2_local = (1 << ((byte)uVar4 & 0x1f)) * 2 + -1;
      }
      if (max2_local != 0) {
        uVar4 = Math::Log2(max2_local);
        max2_local = (1 << ((byte)uVar4 & 0x1f)) * 2 + -1;
      }
      if (max2_local < 1) {
        tmp2 = max2_local << ((byte)min & 0x1f) & 0x7fffffff;
      }
      else {
        uVar4 = Math::Log2(max2_local);
        local_68 = 0x1e;
        local_64 = 0x20 - uVar4;
        piVar5 = min<int>(&max,&local_68);
        iVar2 = max2_local;
        if ((int)(0x20 - uVar4) < *piVar5) {
          tmp2 = 0x7fffffff;
        }
        else {
          local_74[1] = 0x1e;
          piVar5 = min<int>(&max,(int *)(local_74 + 1));
          local_74[2] = iVar2 << ((byte)*piVar5 & 0x1f) & 0x7fffffff;
          local_74[0] = min2_local << ((byte)min & 0x1f) & 0x7fffffff;
          puVar6 = max<unsigned_int>(local_74 + 2,local_74);
          tmp2 = *puVar6;
        }
      }
      bVar8 = (byte)max;
      if (min2_local < 0) {
        local_78 = min2_local << (bVar8 & 0x1f);
        local_7c = max2_local << (bVar8 & 0x1f);
        piVar5 = min<int>(&local_78,&local_7c);
        tmp = *piVar5;
      }
      else {
        src2NewBounds.upperBound = min2_local << ((byte)min & 0x1f);
        src2NewBounds.lowerBound = max2_local << (bVar8 & 0x1f);
        piVar5 = min<int>(&src2NewBounds.upperBound,&src2NewBounds.lowerBound);
        tmp = *piVar5;
      }
      if (tmp != 0) {
        uVar4 = Math::Log2(tmp);
        tmp = 1 << ((byte)uVar4 & 0x1f);
      }
    }
    else {
      tmp = -0x80000000;
      tmp2 = 0x7fffffff;
    }
    break;
  case 4:
    if ((min2 == max2) || (((uint)min2 < 0x20 && ((uint)max2 < 0x20)))) {
      min._0_1_ = (byte)min2 & 0x1f;
      max._0_1_ = (byte)max2 & 0x1f;
    }
    else {
      min._0_1_ = 0;
      max._0_1_ = 0x1f;
    }
    bVar8 = (byte)min;
    if (max1 < 0) {
      bVar8 = (byte)max;
    }
    tmp2 = max1 >> bVar8;
    if (min1 < 0) {
      max._0_1_ = (byte)min;
    }
    tmp = min1 >> (byte)max;
    break;
  case 5:
    if ((min2 == max2) && ((max2 & 0x1fU) == 0)) {
      if (((*(ushort *)&instr->field_0x36 >> 7 & 1) == 0) && (min1 < 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1824,"(instr->ignoreIntOverflow || min1 >= 0)",
                           "instr->ignoreIntOverflow || min1 >= 0");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      tmp = min2_local;
      tmp2 = max2_local;
    }
    else {
      IntConstantBounds::IntConstantBounds((IntConstantBounds *)&umax1,min2,max2);
      local_8c = IntConstantBounds::And_0x1f((IntConstantBounds *)&umax1);
      if ((min2_local < 0) &&
         (((*(ushort *)&_max1_local->field_0x36 >> 7 & 1) == 0 &&
          (bVar3 = IntConstantBounds::Contains(&local_8c,0), bVar3)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x182d,
                           "(min1 >= 0 || instr->ignoreIntOverflow || !src2NewBounds.Contains(0))",
                           "min1 >= 0 || instr->ignoreIntOverflow || !src2NewBounds.Contains(0)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      min = IntConstantBounds::LowerBound(&local_8c);
      max = IntConstantBounds::UpperBound(&local_8c);
      if (max < min) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1831,"(min2 <= max2)","min2 <= max2");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (((min < 1) && ((*(ushort *)&_max1_local->field_0x36 >> 7 & 1) == 0)) && (min2_local < 0))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1833,"(min2 > 0 || instr->ignoreIntOverflow || min1 >= 0)",
                           "min2 > 0 || instr->ignoreIntOverflow || min1 >= 0");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      temp = min2_local;
      local_9c = max2_local;
      if ((uint)max2_local < (uint)min2_local) {
        local_9c = min2_local;
        temp = max2_local;
      }
      if ((min < 0) || (0x1f < max)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x183f,"(min2 >= 0 && max2 < 32)","min2 >= 0 && max2 < 32");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (min2_local < 0) {
        local_9c = 0xffffffff;
      }
      tmp2 = local_9c >> ((byte)min & 0x1f);
      if ((min2_local < 1) && (-1 < max2_local)) {
        tmp = 0;
      }
      else {
        tmp = temp >> ((byte)max & 0x1f);
      }
      if (((*(ushort *)&_max1_local->field_0x36 >> 7 & 1) == 0) && ((tmp < 0 || (tmp2 < 0)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1855,"(instr->ignoreIntOverflow || (min >= 0 && max >= 0))",
                           "instr->ignoreIntOverflow || (min >= 0 && max >= 0)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (tmp2 < tmp) {
        if ((min != 0) ||
           (((*(ushort *)&_max1_local->field_0x36 >> 7 & 1) == 0 && (min2_local < 0)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x1859,"(min2 == 0 && (instr->ignoreIntOverflow || min1 >= 0))",
                             "min2 == 0 && (instr->ignoreIntOverflow || min1 >= 0)");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        tmp = -0x80000000;
        tmp2 = 0x7fffffff;
      }
    }
  }
  *pNewMin = tmp;
  *pNewMax = tmp2;
  return;
}

Assistant:

void
GlobOpt::PropagateIntRangeBinary(IR::Instr *instr, int32 min1, int32 max1,
    int32 min2, int32 max2, int32 *pNewMin, int32* pNewMax)
{
    int32 min, max, tmp, tmp2;

    min = INT32_MIN;
    max = INT32_MAX;

    switch (instr->m_opcode)
    {
    case Js::OpCode::Xor_A:
    case Js::OpCode::Or_A:
        // Find range with highest high order bit
        tmp = ::max((uint32)min1, (uint32)max1);
        tmp2 = ::max((uint32)min2, (uint32)max2);

        if ((uint32)tmp > (uint32)tmp2)
        {
            max = tmp;
        }
        else
        {
            max = tmp2;
        }

        if (max < 0)
        {
            min = INT32_MIN;  // REVIEW: conservative...
            max = INT32_MAX;
        }
        else
        {
            // Turn values like 0x1010 into 0x1111
            max = 1 << Math::Log2(max);
            max = (uint32)(max << 1) - 1;
            min = 0;
        }

        break;

    case Js::OpCode::And_A:

        if (min1 == INT32_MIN && min2 == INT32_MIN)
        {
            // Shortcut
            break;
        }

        // Find range with lowest higher bit
        tmp = ::max((uint32)min1, (uint32)max1);
        tmp2 = ::max((uint32)min2, (uint32)max2);

        if ((uint32)tmp < (uint32)tmp2)
        {
            min = min1;
            max = max1;
        }
        else
        {
            min = min2;
            max = max2;
        }

        // To compute max, look if min has higher high bit
        if ((uint32)min > (uint32)max)
        {
            max = min;
        }

        // If max is negative, max let's assume it could be -1, so result in MAX_INT
        if (max < 0)
        {
            max = INT32_MAX;
        }

        // If min is positive, the resulting min is zero
        if (min >= 0)
        {
            min = 0;
        }
        else
        {
            min = INT32_MIN;
        }
        break;

    case Js::OpCode::Shl_A:
        {
            // Shift count
            if (min2 != max2 && ((uint32)min2 > 0x1F || (uint32)max2 > 0x1F))
            {
                min2 = 0;
                max2 = 0x1F;
            }
            else
            {
                min2 &= 0x1F;
                max2 &= 0x1F;
            }

            int32 min1FreeTopBitCount = min1 ? (sizeof(int32) * 8) - (Math::Log2(min1) + 1) : (sizeof(int32) * 8);
            int32 max1FreeTopBitCount = max1 ? (sizeof(int32) * 8) - (Math::Log2(max1) + 1) : (sizeof(int32) * 8);
            if (min1FreeTopBitCount <= max2 || max1FreeTopBitCount <= max2)
            {
                // If the shift is going to touch the sign bit return the max range
                min = INT32_MIN;
                max = INT32_MAX;
            }
            else
            {
                // Compute max
                // Turn values like 0x1010 into 0x1111
                if (min1)
                {
                    min1 = 1 << Math::Log2(min1);
                    min1 = (min1 << 1) - 1;
                }
                if (max1)
                {
                    max1 = 1 << Math::Log2(max1);
                    max1 = (uint32)(max1 << 1) - 1;
                }

                if (max1 > 0)
                {
                    int32 nrTopBits = (sizeof(int32) * 8) - Math::Log2(max1);
                    if (nrTopBits < ::min(max2, 30))
                        max = INT32_MAX;
                    else
                        max = ::max((max1 << ::min(max2, 30)) & ~0x80000000, (min1 << min2) & ~0x80000000);
                }
                else
                {
                    max = (max1 << min2) & ~0x80000000;
                }
                // Compute min

                if (min1 < 0)
                {
                    min = ::min(min1 << max2, max1 << max2);
                }
                else
                {
                    min = ::min(min1 << min2, max1 << max2);
                }
                // Turn values like 0x1110 into 0x1000
                if (min)
                {
                    min = 1 << Math::Log2(min);
                }
            }
        }
        break;

    case Js::OpCode::Shr_A:
        // Shift count
        if (min2 != max2 && ((uint32)min2 > 0x1F || (uint32)max2 > 0x1F))
        {
            min2 = 0;
            max2 = 0x1F;
        }
        else
        {
            min2 &= 0x1F;
            max2 &= 0x1F;
        }

        // Compute max

        if (max1 < 0)
        {
            max = max1 >> max2;
        }
        else
        {
            max = max1 >> min2;
        }

        // Compute min

        if (min1 < 0)
        {
            min = min1 >> min2;
        }
        else
        {
            min = min1 >> max2;
        }
        break;

    case Js::OpCode::ShrU_A:

        // shift count is constant zero
        if ((min2 == max2) && (max2 & 0x1f) == 0)
        {
            // We can't encode uint32 result, so it has to be used as int32 only or the original value is positive.
            Assert(instr->ignoreIntOverflow || min1 >= 0);
            // We can transfer the signed int32 range.
            min = min1;
            max = max1;
            break;
        }

        const IntConstantBounds src2NewBounds = IntConstantBounds(min2, max2).And_0x1f();
        // Zero is only allowed if result is always a signed int32 or always used as a signed int32
        Assert(min1 >= 0 || instr->ignoreIntOverflow || !src2NewBounds.Contains(0));
        min2 = src2NewBounds.LowerBound();
        max2 = src2NewBounds.UpperBound();

        Assert(min2 <= max2);
        // zero shift count is only allowed if result is used as int32 and/or value is positive
        Assert(min2 > 0 || instr->ignoreIntOverflow || min1 >= 0);

        uint32 umin1 = (uint32)min1;
        uint32 umax1 = (uint32)max1;

        if (umin1 > umax1)
        {
            uint32 temp = umax1;
            umax1 = umin1;
            umin1 = temp;
        }

        Assert(min2 >= 0 && max2 < 32);

        // Compute max

        if (min1 < 0)
        {
            umax1 = UINT32_MAX;
        }
        max = umax1 >> min2;

        // Compute min

        if (min1 <= 0 && max1 >=0)
        {
            min = 0;
        }
        else
        {
            min = umin1 >> max2;
        }

        // We should be able to fit uint32 range as int32
        Assert(instr->ignoreIntOverflow || (min >= 0 && max >= 0) );
        if (min > max)
        {
            // can only happen if shift count can be zero
            Assert(min2 == 0 && (instr->ignoreIntOverflow || min1 >= 0));
            min = Int32ConstMin;
            max = Int32ConstMax;
        }

        break;
    }

    *pNewMin = min;
    *pNewMax = max;
}